

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Grid.h
# Opt level: O1

void __thiscall
pica::Grid<(pica::Dimension)1,_double>::Grid
          (Grid<(pica::Dimension)1,_double> *this,PositionType *origin,PositionType *step,
          IndexType *size)

{
  allocator_type local_61;
  value_type local_60;
  ArrayType *local_58;
  ArrayType *local_50;
  ArrayType *local_48;
  ArrayType *local_40;
  PositionType *local_38;
  
  local_60 = 0.0;
  local_38 = step;
  std::vector<double,_std::allocator<double>_>::vector
            ((vector<double,_std::allocator<double>_> *)this,(long)size->x,&local_60,&local_61);
  local_60 = 0.0;
  std::vector<double,_std::allocator<double>_>::vector
            (&(this->eyData).data,(long)size->x,&local_60,&local_61);
  local_60 = 0.0;
  local_40 = &this->eyData;
  std::vector<double,_std::allocator<double>_>::vector
            (&(this->ezData).data,(long)size->x,&local_60,&local_61);
  local_60 = 0.0;
  local_48 = &this->ezData;
  std::vector<double,_std::allocator<double>_>::vector
            (&(this->bxData).data,(long)size->x,&local_60,&local_61);
  local_58 = &this->byData;
  local_60 = 0.0;
  local_50 = &this->bxData;
  std::vector<double,_std::allocator<double>_>::vector
            (&local_58->data,(long)size->x,&local_60,&local_61);
  local_60 = 0.0;
  std::vector<double,_std::allocator<double>_>::vector
            (&(this->bzData).data,(long)size->x,&local_60,&local_61);
  local_60 = 0.0;
  std::vector<double,_std::allocator<double>_>::vector
            (&(this->jxData).data,(long)size->x,&local_60,&local_61);
  local_60 = 0.0;
  std::vector<double,_std::allocator<double>_>::vector
            (&(this->jyData).data,(long)size->x,&local_60,&local_61);
  local_60 = 0.0;
  std::vector<double,_std::allocator<double>_>::vector
            (&(this->jzData).data,(long)size->x,&local_60,&local_61);
  (this->origin).x = origin->x;
  (this->step).x = local_38->x;
  return;
}

Assistant:

Grid(const PositionType& origin, const PositionType& step, const IndexType& size) :
        exData(size),
        eyData(size),
        ezData(size),
        bxData(size),
        byData(size),
        bzData(size),
        jxData(size),
        jyData(size),
        jzData(size),
        origin(origin),
        step(step) {}